

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::compound_statement(Parser *this)

{
  bool bVar1;
  Node *pNVar2;
  Node *operand1;
  allocator local_79;
  string local_78 [32];
  Node *local_58;
  Node *last_node;
  allocator local_39;
  string local_38 [32];
  Node *local_18;
  Node *statement_node;
  Parser *this_local;
  
  statement_node = (Node *)this;
  Lexer::next_token(this->lex);
  pNVar2 = (Node *)operator_new(0x48);
  last_node._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  Node::Node(pNVar2,SEQ,(Node *)0x0,(Node *)0x0,(string *)local_38,(Node *)0x0,(Node *)0x0);
  last_node._3_1_ = 0;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = pNVar2;
  local_18 = pNVar2;
  bVar1 = tryEat(this,RBRACE);
  if (!bVar1) {
    pNVar2 = statement(this);
    local_58->operand1 = pNVar2;
  }
  while (bVar1 = tryEat(this,RBRACE), ((bVar1 ^ 0xffU) & 1) != 0) {
    pNVar2 = (Node *)operator_new(0x48);
    operand1 = statement(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    Node::Node(pNVar2,SEQ,operand1,(Node *)0x0,(string *)local_78,(Node *)0x0,(Node *)0x0);
    local_58->operand2 = pNVar2;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_58 = local_58->operand2;
  }
  Lexer::next_token(this->lex);
  return local_18;
}

Assistant:

Node* Parser::compound_statement()
{
	lex->next_token();

	Node* statement_node = new Node(node_type::SEQ);
	Node* last_node = statement_node;
	if (!tryEat(token_type::RBRACE)) last_node->operand1 = statement();

	while (!tryEat(token_type::RBRACE)) {

		last_node->operand2 = new Node(node_type::SEQ, statement());

		last_node = last_node->operand2;
	}
	lex->next_token();
	
	return statement_node;
}